

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O3

UInt32 MatchFinder_GetHashMask2(CMatchFinder *p,UInt32 hs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar5 = (uint)p;
  uVar1 = 0xffff;
  if (uVar5 != 2) {
    uVar4 = (ulong)(hs - 1);
    if (hs == 0) {
      uVar4 = 0;
    }
    uVar1 = (uint)(uVar4 >> 1) | (uint)uVar4;
    uVar1 = uVar1 >> 2 | uVar1;
    uVar1 = uVar1 >> 4 | uVar1;
    uVar2 = uVar1 >> 8 | uVar1;
    uVar3 = 0xff0000;
    if (uVar1 < 0x1000000) {
      uVar3 = uVar2;
    }
    if (uVar5 != 3) {
      uVar3 = uVar2;
    }
    uVar1 = 0xffff;
    if (4 < uVar5) {
      uVar1 = 0x3ffff;
    }
    uVar1 = uVar1 | uVar3;
  }
  return uVar1;
}

Assistant:

static UInt32 MatchFinder_GetHashMask2(CMatchFinder *p, UInt32 hs)
{
  if (p->numHashBytes == 2)
    return (1 << 16) - 1;
  if (hs != 0)
    hs--;
  hs |= (hs >> 1);
  hs |= (hs >> 2);
  hs |= (hs >> 4);
  hs |= (hs >> 8);
  // we propagated 16 bits in (hs). Low 16 bits must be set later
  if (hs >= (1 << 24))
  {
    if (p->numHashBytes == 3)
      hs = (1 << 24) - 1;
    /* if (bigHash) mode, GetHeads4b() in LzFindMt.c needs (hs >= ((1 << 24) - 1))) */
  }
  // (hash_size >= (1 << 16)) : Required for (numHashBytes > 2)
  hs |= (1 << 16) - 1; /* don't change it! */
  // bt5: we adjust the size with recommended minimum size
  if (p->numHashBytes >= 5)
    hs |= (256 << kLzHash_CrcShift_2) - 1;
  return hs;
}